

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86.cpp
# Opt level: O2

int __thiscall
ncnn::HardSigmoid_x86::forward_inplace(HardSigmoid_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  undefined1 auVar7 [16];
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [16];
  long lVar12;
  long lVar13;
  int iVar14;
  undefined1 auVar15 [16];
  float fVar16;
  
  auVar7 = _DAT_004c5ca0;
  iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar10 = 0;
  uVar9 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar9 = uVar10;
  }
  for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
    pvVar2 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pauVar11 = (undefined1 (*) [16])(sVar4 * uVar10 * sVar3 + (long)pvVar2);
    pp_Var5 = this->_vptr_HardSigmoid_x86;
    lVar12 = 0;
    for (iVar14 = 0; iVar14 + 3 < iVar8; iVar14 = iVar14 + 4) {
      fVar1 = *(float *)(&this->field_0xd0 + (long)pp_Var5[-3]);
      fVar16 = *(float *)(&this->field_0xd4 + (long)pp_Var5[-3]);
      auVar15._0_4_ = fVar1 * *(float *)*pauVar11 + fVar16;
      auVar15._4_4_ = fVar1 * *(float *)((long)*pauVar11 + 4) + fVar16;
      auVar15._8_4_ = fVar1 * *(float *)((long)*pauVar11 + 8) + fVar16;
      auVar15._12_4_ = fVar1 * *(float *)((long)*pauVar11 + 0xc) + fVar16;
      auVar15 = maxps(auVar15,ZEXT816(0));
      auVar15 = minps(auVar15,auVar7);
      *pauVar11 = auVar15;
      pauVar11 = pauVar11 + 1;
      lVar12 = lVar12 + 4;
    }
    pp_Var5 = this->_vptr_HardSigmoid_x86;
    lVar13 = sVar4 * sVar3 * uVar10;
    for (; (int)lVar12 < iVar8; lVar12 = lVar12 + 1) {
      fVar1 = *(float *)((long)pvVar2 + lVar12 * 4 + lVar13);
      p_Var6 = pp_Var5[-3];
      fVar16 = 0.0;
      if ((*(float *)(&this->field_0xd8 + (long)p_Var6) <= fVar1) &&
         (fVar16 = 1.0,
         fVar1 < *(float *)(&this->field_0xdc + (long)p_Var6) ||
         fVar1 == *(float *)(&this->field_0xdc + (long)p_Var6))) {
        fVar16 = fVar1 * *(float *)(&this->field_0xd0 + (long)p_Var6) +
                 *(float *)(&this->field_0xd4 + (long)p_Var6);
      }
      *(float *)((long)pvVar2 + lVar12 * 4 + lVar13) = fVar16;
    }
  }
  return 0;
}

Assistant:

int HardSigmoid_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ptr++;
        }
    }

    return 0;
}